

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm_add_8x8_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  byte bVar1;
  byte *in_RCX;
  undefined4 in_EDX;
  int32_t *in_RSI;
  tran_low_t *in_RDI;
  int unaff_retaddr;
  int32_t *src;
  TX_TYPE tx_type;
  int bd;
  int in_stack_000001ec;
  TX_TYPE in_stack_000001f3;
  int in_stack_000001f4;
  uint16_t *in_stack_000001f8;
  int32_t *in_stack_00000200;
  int eob;
  undefined4 in_stack_ffffffffffffffe8;
  
  eob = *(int *)(in_RCX + 8);
  bVar1 = *in_RCX;
  cast_to_int32(in_RDI);
  if (bVar1 - 9 < 7) {
    av1_highbd_inv_txfm2d_add_universe_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RCX >> 0x20),(TX_TYPE)((ulong)in_RCX >> 0x18),
               (TX_SIZE)((ulong)in_RCX >> 0x10),eob,unaff_retaddr);
  }
  else {
    av1_inv_txfm2d_add_8x8_sse4_1
              (in_stack_00000200,in_stack_000001f8,in_stack_000001f4,in_stack_000001f3,
               in_stack_000001ec);
  }
  return;
}

Assistant:

static void av1_highbd_inv_txfm_add_8x8_sse4_1(const tran_low_t *input,
                                               uint8_t *dest, int stride,
                                               const TxfmParam *txfm_param) {
  int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const int32_t *src = cast_to_int32(input);
  switch (tx_type) {
    case IDTX:
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      av1_highbd_inv_txfm2d_add_universe_sse4_1(input, dest, stride, tx_type,
                                                txfm_param->tx_size,
                                                txfm_param->eob, bd);
      break;
    default:
      av1_inv_txfm2d_add_8x8_sse4_1(src, CONVERT_TO_SHORTPTR(dest), stride,
                                    tx_type, bd);
      break;
  }
}